

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_valid_no_geom_tri(REF_GRID ref_grid,REF_INT node,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  REF_INT cell;
  char *pcVar6;
  REF_BOOL valid;
  REF_BOOL *local_b0;
  REF_INT nodes [27];
  
  if (ref_grid->twod == 0) {
    *allowed = 1;
  }
  else {
    ref_node = ref_grid->node;
    *allowed = 0;
    ref_cell = ref_grid->cell[3];
    uVar5 = 0xffffffff;
    cell = -1;
    if (-1 < node) {
      pRVar1 = ref_cell->ref_adj;
      uVar5 = 0xffffffff;
      cell = -1;
      if (node < pRVar1->nnode) {
        uVar3 = pRVar1->first[(uint)node];
        uVar5 = 0xffffffff;
        cell = -1;
        if ((long)(int)uVar3 != -1) {
          cell = pRVar1->item[(int)uVar3].ref;
          uVar5 = (ulong)uVar3;
        }
      }
    }
    local_b0 = allowed;
    while ((int)uVar5 != -1) {
      uVar3 = ref_cell_nodes(ref_cell,cell,nodes);
      if (uVar3 != 0) {
        pcVar6 = "nodes";
        uVar4 = 0x108;
LAB_001c62c1:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               uVar4,"ref_smooth_valid_no_geom_tri",(ulong)uVar3,pcVar6);
        return uVar3;
      }
      uVar3 = ref_node_tri_twod_orientation(ref_node,nodes,&valid);
      if (uVar3 != 0) {
        pcVar6 = "valid";
        uVar4 = 0x109;
        goto LAB_001c62c1;
      }
      if (valid == 0) {
        return 0;
      }
      pRVar2 = ref_cell->ref_adj->item;
      uVar5 = (ulong)pRVar2[(int)uVar5].next;
      cell = -1;
      if (uVar5 != 0xffffffffffffffff) {
        cell = pRVar2[uVar5].ref;
      }
    }
    *local_b0 = 1;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_valid_no_geom_tri(REF_GRID ref_grid,
                                                       REF_INT node,
                                                       REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL valid;

  if (!ref_grid_twod(ref_grid)) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}